

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocsp.cc
# Opt level: O1

OCSPRevocationStatus
bssl::anon_unknown_20::CheckOCSP
          (string_view raw_response,string_view certificate_der,ParsedCertificate *certificate,
          string_view issuer_certificate_der,ParsedCertificate *issuer_certificate,
          int64_t verify_time_epoch_seconds,optional<long> max_age_seconds,
          ResponseStatus *response_details)

{
  optional<long> max_age_seconds_00;
  Input extensions_tlv;
  bool bVar1;
  OCSPRevocationStatus OVar2;
  _Rb_tree_node_base *p_Var3;
  OCSPResponseData *out;
  OCSPRevocationStatus OVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Input raw_tlv;
  Input raw_tlv_00;
  string_view der;
  string_view der_00;
  OCSPResponseData response_data;
  OCSPResponse response;
  undefined8 in_stack_fffffffffffffed0;
  undefined1 local_128 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_120;
  _Base_ptr local_118;
  _Rb_tree_node_base *local_110;
  _Rb_tree_node_base *local_108;
  size_t local_100;
  ParsedCertificate *local_f8;
  OCSPResponseData local_f0;
  OCSPResponse local_88;
  
  out = (OCSPResponseData *)certificate_der._M_str;
  *response_details = NOT_CHECKED;
  if ((uchar *)raw_response._M_len == (uchar *)0x0) {
    *response_details = MISSING;
    return MAX_VALUE;
  }
  local_88.data.data_.data_ = (uchar *)0x0;
  local_88.data.data_.size_ = 0;
  local_88.signature.bytes_.data_.data_ = (uchar *)0x0;
  local_88.signature.bytes_.data_.size_ = 0;
  local_88.signature.unused_bits_ = '\0';
  local_88.certs.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.certs.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.certs.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  raw_tlv.data_.size_ = (size_t)&local_88;
  raw_tlv.data_.data_ = (uchar *)raw_response._M_len;
  bVar1 = ParseOCSPResponse((bssl *)raw_response._M_str,raw_tlv,(OCSPResponse *)out);
  if (bVar1) {
    if (local_88.status == SUCCESSFUL) {
      local_f0.responder_id.key_hash.data_.data_ = (uchar *)0x0;
      local_f0.responder_id.key_hash.data_.size_ = 0;
      local_f0.responder_id.name.data_.data_ = (uchar *)0x0;
      local_f0.responder_id.name.data_.size_ = 0;
      local_f0.responses.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_f0.responses.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f0.responses.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_f0.extensions.data_.data_ = (uchar *)0x0;
      local_f0.extensions.data_.size_ = 0;
      raw_tlv_00.data_.size_ = (size_t)&local_f0;
      raw_tlv_00.data_.data_ = (uchar *)local_88.data.data_.size_;
      bVar1 = ParseOCSPResponseData((bssl *)local_88.data.data_.data_,raw_tlv_00,out);
      if (bVar1) {
        if (local_f0.has_extensions == true) {
          extensions_tlv.data_.size_ = local_f0.extensions.data_.size_;
          extensions_tlv.data_.data_ = local_f0.extensions.data_.data_;
          p_Stack_120 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((ulong)p_Stack_120 & 0xffffffff00000000);
          local_118 = (_Base_ptr)0x0;
          local_100 = 0;
          local_110 = (_Rb_tree_node_base *)&p_Stack_120;
          local_108 = (_Rb_tree_node_base *)&p_Stack_120;
          bVar1 = ParseExtensions(extensions_tlv,
                                  (map<bssl::der::Input,_bssl::ParsedExtension,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                                   *)local_128);
          if (!bVar1) {
            *response_details = PARSE_RESPONSE_DATA_ERROR;
            ::std::
            _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
            ::~_Rb_tree((_Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                         *)local_128);
            goto LAB_004b01ae;
          }
          bVar1 = local_110 == (_Rb_tree_node_base *)&p_Stack_120;
          local_f8 = issuer_certificate;
          if (!bVar1) {
            p_Var3 = local_110;
            if (*(char *)&local_110[2]._M_left == '\0') {
              do {
                p_Var3 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var3);
                bVar1 = p_Var3 == (_Rb_tree_node_base *)&p_Stack_120;
                if (bVar1) goto LAB_004b0180;
              } while (*(char *)&p_Var3[2]._M_left != '\x01');
            }
            *response_details = RESPONSE_STATUS_MAX;
          }
LAB_004b0180:
          ::std::
          _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
          ::~_Rb_tree((_Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                       *)local_128);
          OVar4 = MAX_VALUE;
          issuer_certificate = local_f8;
          if (bVar1) goto LAB_004b019c;
        }
        else {
LAB_004b019c:
          if (certificate == (ParsedCertificate *)0x0) {
            der._M_str = (char *)certificate_der._M_len;
            der._M_len = (size_t)local_128;
            OCSPParseCertificate(der);
            this_00 = p_Stack_120;
            certificate = (ParsedCertificate *)local_128;
            local_128 = (undefined1  [8])0x0;
            p_Stack_120 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          if (issuer_certificate == (ParsedCertificate *)0x0) {
            der_00._M_str = (char *)issuer_certificate_der._M_len;
            der_00._M_len = (size_t)local_128;
            OCSPParseCertificate(der_00);
            this = p_Stack_120;
            issuer_certificate = (ParsedCertificate *)local_128;
            local_128 = (undefined1  [8])0x0;
            p_Stack_120 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          if (certificate == (ParsedCertificate *)0x0 ||
              issuer_certificate == (ParsedCertificate *)0x0) {
            *response_details = NOT_CHECKED;
LAB_004b028e:
            OVar4 = MAX_VALUE;
          }
          else {
            bVar1 = bssl::der::operator<
                              (&local_f0.produced_at,&(certificate->tbs_).validity_not_before);
            if ((bVar1) ||
               (bVar1 = bssl::der::operator>
                                  (&local_f0.produced_at,&(certificate->tbs_).validity_not_after),
               bVar1)) {
              *response_details = BAD_PRODUCED_AT;
              goto LAB_004b028e;
            }
            max_age_seconds_00.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._8_8_ = in_stack_fffffffffffffed0;
            max_age_seconds_00.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._M_payload = (_Storage<long,_true>)response_details;
            OVar2 = GetRevocationStatusForCert
                              ((anon_unknown_20 *)&local_f0,(OCSPResponseData *)certificate,
                               issuer_certificate,(ParsedCertificate *)verify_time_epoch_seconds,
                               max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
                               super__Optional_payload_base<long>._M_payload._M_value,
                               max_age_seconds_00,
                               (ResponseStatus *)
                               (ulong)(uint)max_age_seconds.super__Optional_base<long,_true,_true>.
                                            _M_payload.super__Optional_payload_base<long>._8_4_);
            bVar1 = VerifyOCSPResponseSignature(&local_88,&local_f0,issuer_certificate);
            OVar4 = MAX_VALUE;
            if (bVar1) {
              OVar4 = OVar2;
            }
          }
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
        }
      }
      else {
        *response_details = PARSE_RESPONSE_DATA_ERROR;
LAB_004b01ae:
        OVar4 = MAX_VALUE;
      }
      if (local_f0.responses.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f0.responses.
                        super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_f0.responses.
                              super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_f0.responses.
                              super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_004b0092;
    }
    *response_details = ERROR_RESPONSE;
  }
  else {
    *response_details = PARSE_RESPONSE_ERROR;
  }
  OVar4 = MAX_VALUE;
LAB_004b0092:
  if (local_88.certs.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.certs.
                    super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.certs.
                          super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.certs.
                          super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return OVar4;
}

Assistant:

OCSPRevocationStatus CheckOCSP(
    std::string_view raw_response, std::string_view certificate_der,
    const ParsedCertificate *certificate,
    std::string_view issuer_certificate_der,
    const ParsedCertificate *issuer_certificate,
    int64_t verify_time_epoch_seconds, std::optional<int64_t> max_age_seconds,
    OCSPVerifyResult::ResponseStatus *response_details) {
  *response_details = OCSPVerifyResult::NOT_CHECKED;

  if (raw_response.empty()) {
    *response_details = OCSPVerifyResult::MISSING;
    return OCSPRevocationStatus::UNKNOWN;
  }

  OCSPResponse response;
  if (!ParseOCSPResponse(StringAsBytes(raw_response), &response)) {
    *response_details = OCSPVerifyResult::PARSE_RESPONSE_ERROR;
    return OCSPRevocationStatus::UNKNOWN;
  }

  // RFC 6960 defines all responses |response_status| != SUCCESSFUL as error
  // responses. No revocation information is provided on error responses, and
  // the OCSPResponseData structure is not set.
  if (response.status != OCSPResponse::ResponseStatus::SUCCESSFUL) {
    *response_details = OCSPVerifyResult::ERROR_RESPONSE;
    return OCSPRevocationStatus::UNKNOWN;
  }

  // Actual revocation information is contained within the BasicOCSPResponse as
  // a ResponseData structure. The BasicOCSPResponse was parsed above, and
  // contains an unparsed ResponseData. From RFC 6960:
  //
  // BasicOCSPResponse       ::= SEQUENCE {
  //    tbsResponseData      ResponseData,
  //    signatureAlgorithm   AlgorithmIdentifier,
  //    signature            BIT STRING,
  //    certs            [0] EXPLICIT SEQUENCE OF Certificate OPTIONAL }
  //
  // ResponseData ::= SEQUENCE {
  //     version              [0] EXPLICIT Version DEFAULT v1,
  //     responderID              ResponderID,
  //     producedAt               GeneralizedTime,
  //     responses                SEQUENCE OF SingleResponse,
  //     responseExtensions   [1] EXPLICIT Extensions OPTIONAL }
  OCSPResponseData response_data;
  if (!ParseOCSPResponseData(response.data, &response_data)) {
    *response_details = OCSPVerifyResult::PARSE_RESPONSE_DATA_ERROR;
    return OCSPRevocationStatus::UNKNOWN;
  }

  // Process the OCSP ResponseData extensions. In particular, must reject if
  // there are any critical extensions that are not understood.
  if (response_data.has_extensions &&
      !ParseOCSPResponseDataExtensions(response_data.extensions,
                                       response_details)) {
    return OCSPRevocationStatus::UNKNOWN;
  }

  std::shared_ptr<const ParsedCertificate> parsed_certificate;
  std::shared_ptr<const ParsedCertificate> parsed_issuer_certificate;
  if (!certificate) {
    parsed_certificate = OCSPParseCertificate(certificate_der);
    certificate = parsed_certificate.get();
  }
  if (!issuer_certificate) {
    parsed_issuer_certificate = OCSPParseCertificate(issuer_certificate_der);
    issuer_certificate = parsed_issuer_certificate.get();
  }

  if (!certificate || !issuer_certificate) {
    *response_details = OCSPVerifyResult::NOT_CHECKED;
    return OCSPRevocationStatus::UNKNOWN;
  }

  // If producedAt is outside of the certificate validity period, reject the
  // response.
  if (response_data.produced_at < certificate->tbs().validity_not_before ||
      response_data.produced_at > certificate->tbs().validity_not_after) {
    *response_details = OCSPVerifyResult::BAD_PRODUCED_AT;
    return OCSPRevocationStatus::UNKNOWN;
  }

  // Look through all of the OCSPSingleResponses for a match (based on CertID
  // and time).
  OCSPRevocationStatus status = GetRevocationStatusForCert(
      response_data, certificate, issuer_certificate, verify_time_epoch_seconds,
      max_age_seconds, response_details);

  // Check that the OCSP response has a valid signature. It must either be
  // signed directly by the issuing certificate, or a valid authorized
  // responder.
  if (!VerifyOCSPResponseSignature(response, response_data,
                                   issuer_certificate)) {
    return OCSPRevocationStatus::UNKNOWN;
  }

  return status;
}